

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-pool.cpp
# Opt level: O0

bool __thiscall
MemPool::deleteRecord(MemPool *this,uchar *blkAddress,uint relativeOffset,uint recordSize)

{
  long lVar1;
  uchar *__first2;
  bool bVar2;
  ulong uVar3;
  uchar *__last1;
  uchar *puVar4;
  undefined8 uStack_a0;
  uchar auStack_98 [40];
  uchar *local_70;
  MemPool *local_68;
  exception *e;
  ulong local_50;
  unsigned_long __vla_expr0;
  char local_29;
  uint local_28;
  uint local_24;
  uint recordSize_local;
  uint relativeOffset_local;
  uchar *blkAddress_local;
  MemPool *this_local;
  
  this->memPoolUsedRecords = this->memPoolUsedRecords - recordSize;
  local_29 = '\0';
  uStack_a0 = 0x1184dc;
  local_68 = this;
  local_28 = recordSize;
  local_24 = relativeOffset;
  _recordSize_local = blkAddress;
  blkAddress_local = (uchar *)this;
  std::fill<unsigned_char*,char>
            (blkAddress + relativeOffset,blkAddress + relativeOffset + recordSize,&local_29);
  local_50 = (ulong)local_28;
  lVar1 = -(local_50 + 0xf & 0xfffffffffffffff0);
  puVar4 = auStack_98 + lVar1;
  uVar3 = (ulong)local_28;
  e._7_1_ = 0;
  local_70 = puVar4;
  __vla_expr0 = (unsigned_long)auStack_98;
  *(undefined8 *)((long)&uStack_a0 + lVar1) = 0x11851a;
  std::fill<unsigned_char*,char>(puVar4,puVar4 + uVar3,(char *)((long)&e + 7));
  __first2 = _recordSize_local;
  puVar4 = local_70;
  __last1 = local_70 + local_28;
  *(undefined8 *)((long)&uStack_a0 + lVar1) = 0x118532;
  bVar2 = std::equal<unsigned_char*,unsigned_char*>(puVar4,__last1,__first2);
  if (bVar2) {
    local_68->memPoolUsedBlks = local_68->memPoolUsedBlks - local_68->blkSize;
  }
  return true;
}

Assistant:

bool MemPool::deleteRecord(uchar *blkAddress, uint relativeOffset, uint recordSize) {
    try {
        // to delete a record, we can change the values stored in that record to NULL
        // traverse from the beginning of the record address to the end based on the size of the record
        // fill the elements to the null character
        memPoolUsedRecords-=recordSize;
        fill(blkAddress+relativeOffset, blkAddress+relativeOffset+recordSize, '\0');

        uchar cmpBlk [recordSize];
        fill(cmpBlk, cmpBlk+recordSize, '\0');

        if(equal(cmpBlk, cmpBlk+recordSize, blkAddress)){
            memPoolUsedBlks-=blkSize;
        }

        return true;
    }

    catch(exception &e) {
        cout << "Exception" <<e.what() << "\n";
        cout << "Delete record or block failed" << "\n";
        return false;
    }
}